

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase112::run(TestCase112 *this)

{
  PipelineHook **cap;
  Reader reader;
  PromiseNode *pPVar1;
  PipelineOp *pPVar2;
  size_t sVar3;
  long *plVar4;
  undefined8 uVar5;
  Disposer *pDVar6;
  CapTableBuilder *pCVar7;
  WirePointer *pWVar8;
  ClientHook *pCVar9;
  RequestHook *pRVar10;
  undefined4 uVar11;
  int iVar12;
  PipelineHook *pPVar13;
  PipelineHook *pPVar14;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar15;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *extraout_RDX_10;
  void *pvVar16;
  int in_R8D;
  Own<capnp::ClientHook> OVar17;
  Reader RVar18;
  int chainedCallCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  int callCount;
  Response<capnproto_test::capnp::test::TestAllTypes> response2;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> promise;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> pipelinePromise;
  RemotePromise<capnproto_test::capnp::test::TestAllTypes> pipelinePromise2;
  Client client;
  WaitScope waitScope;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  request;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  pipelineRequest2;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  pipelineRequest;
  EventLoop loop;
  int local_2bc;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> local_2b8;
  long *local_280;
  int local_274;
  Pipeline local_270;
  undefined8 uStack_248;
  undefined8 *local_240;
  long *local_238;
  ArrayPtr<const_char> local_230;
  long *local_220;
  undefined1 local_218 [32];
  PipelineOp *local_1f8;
  Disposer *pDStack_1f0;
  ArrayDisposer *local_1e8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_1e0;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_1a8;
  undefined1 local_170 [8];
  Client local_168;
  EventLoop *local_158;
  undefined4 local_150;
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  local_148;
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  local_110;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_d8;
  EventLoop local_a0;
  Maybe<capnp::MessageSize> local_68;
  Maybe<capnp::MessageSize> local_50;
  Maybe<capnp::MessageSize> local_38;
  
  kj::EventLoop::EventLoop(&local_a0);
  local_150 = 0xffffffff;
  local_158 = &local_a0;
  kj::EventLoop::enterScope(&local_a0);
  local_274 = 0;
  local_2bc = 0;
  kj::heap<capnp::_::TestPipelineImpl,int&>((kj *)&local_270,&local_274);
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.disposer = local_270._typeless.hook.disposer;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)(local_270._typeless.hook.ptr + 2);
  if ((CapTableReader *)local_270._typeless.hook.ptr == (CapTableReader *)0x0) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  }
  local_270._typeless.hook.ptr = (PipelineHook *)0x0;
  OVar17 = Capability::Client::makeLocalClient
                     (&local_168,(Own<capnp::Capability::Server> *)&local_2b8);
  pPVar1 = local_2b8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.ptr;
  if ((CapTableReader *)
      local_2b8.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
      super_PromiseBase.node.ptr != (CapTableReader *)0x0) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)((Arena *)
              (local_2b8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_2b8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
               ,OVar17.ptr);
  }
  pPVar13 = local_270._typeless.hook.ptr;
  local_170 = (undefined1  [8])&capnproto_test::capnp::test::TestPipeline::Client::typeinfo;
  if ((CapTableReader *)local_270._typeless.hook.ptr != (CapTableReader *)0x0) {
    local_270._typeless.hook.ptr = (PipelineHook *)0x0;
    (*(code *)((Arena *)(local_270._typeless.hook.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_270._typeless.hook.disposer,
               pPVar13->_vptr_PipelineHook[-2] + (long)&pPVar13->_vptr_PipelineHook);
  }
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestPipeline::Client::getCapRequest
            (&local_148,(Client *)local_170,&local_38);
  *(undefined4 *)local_148.super_Builder._builder.data = 0xea;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)local_218,&local_2bc);
  pPVar13 = (PipelineHook *)local_218._8_8_;
  cap = &local_270._typeless.hook.ptr;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.disposer = (Disposer *)local_218._0_8_;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)(local_218._8_8_ + 0x10);
  if ((PipelineHook *)local_218._8_8_ == (PipelineHook *)0x0) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  }
  local_218._8_8_ = (PromiseNode *)0x0;
  OVar17 = Capability::Client::makeLocalClient
                     ((Client *)cap,(Own<capnp::Capability::Server> *)&local_2b8);
  pPVar1 = local_2b8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.ptr;
  if ((PipelineHook *)
      local_2b8.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
      super_PromiseBase.node.ptr != (PipelineHook *)0x0) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)
              &(local_2b8.
                super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                .super_PromiseBase.node.disposer)->_vptr_Disposer)->arena->_vptr_Arena)
              (local_2b8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
               ,OVar17.ptr);
  }
  local_270._typeless.hook.disposer = (Disposer *)&Capability::Client::typeinfo;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.disposer = (Disposer *)local_148.super_Builder._builder.segment;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)local_148.super_Builder._builder.capTable;
  local_2b8.super_Pipeline._typeless.hook.disposer =
       (Disposer *)local_148.super_Builder._builder.pointers;
  PointerBuilder::setCapability((PointerBuilder *)&local_2b8,(Own<capnp::ClientHook> *)cap);
  pPVar2 = local_270._typeless.ops.ptr;
  pvVar15 = extraout_RDX;
  if ((WirePointer *)local_270._typeless.ops.ptr != (WirePointer *)0x0) {
    local_270._typeless.ops.ptr = (PipelineOp *)0x0;
    (**(local_270._typeless.hook.ptr)->_vptr_PipelineHook)
              (local_270._typeless.hook.ptr,
               (long)&((WireValue<uint32_t>_conflict *)&pPVar2->type)->value +
               *(long *)((long)*(WirePointer *)pPVar2 + -0x10));
    pvVar15 = extraout_RDX_00;
  }
  uVar5 = local_218._8_8_;
  if ((PromiseNode *)local_218._8_8_ != (PromiseNode *)0x0) {
    local_218._8_8_ = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_218._0_8_)->arena->_vptr_Arena)
              (local_218._0_8_,
               ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5);
    pvVar15 = extraout_RDX_01;
  }
  Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  ::send((Request<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
          *)local_218,(int)&local_148,pvVar15,(size_t)pPVar13,in_R8D);
  AnyPointer::Pipeline::getPointerField((Pipeline *)&local_2b8,(Pipeline *)(local_218 + 0x10),1);
  local_270._typeless.hook.disposer =
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.disposer;
  local_270._typeless.hook.ptr =
       (PipelineHook *)
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.ptr;
  local_270._typeless.ops.ptr = (PipelineOp *)local_2b8.super_Pipeline._typeless.hook.disposer;
  local_270._typeless.ops.size_ = (size_t)local_2b8.super_Pipeline._typeless.hook.ptr;
  local_270._typeless.ops.disposer = (ArrayDisposer *)local_2b8.super_Pipeline._typeless.ops.ptr;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap((Client *)&local_1e0,&local_270);
  local_50.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_d8,(Client *)&local_1e0,&local_50);
  pvVar15 = local_1e0.super_Builder._builder.data;
  pvVar16 = extraout_RDX_02;
  if ((long *)local_1e0.super_Builder._builder.data != (long *)0x0) {
    local_1e0.super_Builder._builder.data = (long *)0x0;
    (**((local_1e0.super_Builder._builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
              (local_1e0.super_Builder._builder.capTable,(long)pvVar15 + *(long *)(*pvVar15 + -0x10)
              );
    pvVar16 = extraout_RDX_03;
  }
  pPVar14 = (PipelineHook *)local_270._typeless.ops.size_;
  pPVar2 = local_270._typeless.ops.ptr;
  if ((WirePointer *)local_270._typeless.ops.ptr != (WirePointer *)0x0) {
    local_270._typeless.ops.ptr = (PipelineOp *)0x0;
    local_270._typeless.ops.size_ = 0;
    pPVar13 = pPVar14;
    (**(code **)*(PipelineOp *)local_270._typeless.ops.disposer)
              (local_270._typeless.ops.disposer,pPVar2,8,pPVar14,pPVar14,0);
    in_R8D = (int)pPVar13;
    pPVar13 = pPVar14;
    pvVar16 = extraout_RDX_04;
  }
  pPVar14 = local_270._typeless.hook.ptr;
  if ((CapTableReader *)local_270._typeless.hook.ptr != (CapTableReader *)0x0) {
    local_270._typeless.hook.ptr = (PipelineHook *)0x0;
    (*(code *)((SegmentReader *)&(local_270._typeless.hook.disposer)->_vptr_Disposer)->arena->
              _vptr_Arena)
              (local_270._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar14->_vptr_PipelineHook + (long)pPVar14->_vptr_PipelineHook[-2]));
    pvVar16 = extraout_RDX_05;
  }
  *(undefined4 *)local_d8.super_Builder._builder.data = 0x141;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_1e0,(int)&local_d8,pvVar16,(size_t)pPVar13,in_R8D);
  AnyPointer::Pipeline::getPointerField((Pipeline *)&local_2b8,(Pipeline *)(local_218 + 0x10),1);
  local_270._typeless.hook.disposer =
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.disposer;
  local_270._typeless.hook.ptr =
       (PipelineHook *)
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.ptr;
  local_270._typeless.ops.ptr = (PipelineOp *)local_2b8.super_Pipeline._typeless.hook.disposer;
  local_270._typeless.ops.size_ = (size_t)local_2b8.super_Pipeline._typeless.hook.ptr;
  local_270._typeless.ops.disposer = (ArrayDisposer *)local_2b8.super_Pipeline._typeless.ops.ptr;
  capnproto_test::capnp::test::TestPipeline::Box::Pipeline::getCap((Client *)&local_230,&local_270);
  (**(code **)(**(long **)((long)&local_230.size_ + *(long *)(local_230.ptr + -0x18)) + 0x20))
            (&local_2b8);
  local_1a8.super_Builder._builder.capTable =
       (CapTableBuilder *)
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.disposer;
  local_1a8.super_Builder._builder.data =
       local_2b8.
       super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
       super_PromiseBase.node.ptr;
  local_1a8.super_Builder._builder.segment =
       (SegmentBuilder *)&capnproto_test::capnp::test::TestExtends::Client::typeinfo;
  local_68.ptr.isSet = false;
  capnproto_test::capnp::test::TestExtends::Client::graultRequest
            (&local_110,(Client *)&local_1a8,&local_68);
  pvVar15 = local_1a8.super_Builder._builder.data;
  pvVar16 = extraout_RDX_06;
  if ((CapTableReader *)local_1a8.super_Builder._builder.data != (CapTableReader *)0x0) {
    local_1a8.super_Builder._builder.data = (CapTableReader *)0x0;
    (*(code *)((SegmentReader *)&(local_1a8.super_Builder._builder.capTable)->super_CapTableReader)
              ->arena->_vptr_Arena)
              (local_1a8.super_Builder._builder.capTable,
               (_func_int *)((long)(_func_int ***)pvVar15 + (long)(*(_func_int ***)pvVar15)[-2]));
    pvVar16 = extraout_RDX_07;
  }
  plVar4 = local_220;
  if (local_220 != (long *)0x0) {
    local_220 = (long *)0x0;
    (*(code *)**(undefined8 **)local_230.size_)
              (local_230.size_,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    pvVar16 = extraout_RDX_08;
  }
  pPVar14 = (PipelineHook *)local_270._typeless.ops.size_;
  pPVar2 = local_270._typeless.ops.ptr;
  if ((WirePointer *)local_270._typeless.ops.ptr != (WirePointer *)0x0) {
    local_270._typeless.ops.ptr = (PipelineOp *)0x0;
    local_270._typeless.ops.size_ = 0;
    pPVar13 = pPVar14;
    (**(code **)*(PipelineOp *)local_270._typeless.ops.disposer)
              (local_270._typeless.ops.disposer,pPVar2,8,pPVar14,pPVar14,0);
    in_R8D = (int)pPVar13;
    pPVar13 = pPVar14;
    pvVar16 = extraout_RDX_09;
  }
  pPVar14 = local_270._typeless.hook.ptr;
  if ((CapTableReader *)local_270._typeless.hook.ptr != (CapTableReader *)0x0) {
    local_270._typeless.hook.ptr = (PipelineHook *)0x0;
    (*(code *)((SegmentReader *)&(local_270._typeless.hook.disposer)->_vptr_Disposer)->arena->
              _vptr_Arena)
              (local_270._typeless.hook.disposer,
               (_func_int *)
               ((long)&pPVar14->_vptr_PipelineHook + (long)pPVar14->_vptr_PipelineHook[-2]));
    pvVar16 = extraout_RDX_10;
  }
  Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
  ::send(&local_1a8,(int)&local_110,pvVar16,(size_t)pPVar13,in_R8D);
  local_2b8.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
  local_2b8.super_Pipeline._typeless.ops.size_ = 0;
  local_2b8.super_Pipeline._typeless.hook.disposer = (Disposer *)0x0;
  local_2b8.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.disposer = (Disposer *)0x0;
  local_2b8.
  super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
  super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  local_2b8.super_Pipeline._typeless.ops.disposer = (ArrayDisposer *)0x0;
  RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults>::operator=
            ((RemotePromise<capnproto_test::capnp::test::TestPipeline::GetCapResults> *)local_218,
             &local_2b8);
  sVar3 = local_2b8.super_Pipeline._typeless.ops.size_;
  pPVar2 = local_2b8.super_Pipeline._typeless.ops.ptr;
  if (local_2b8.super_Pipeline._typeless.ops.ptr != (PipelineOp *)0x0) {
    local_2b8.super_Pipeline._typeless.ops.ptr = (PipelineOp *)0x0;
    local_2b8.super_Pipeline._typeless.ops.size_ = 0;
    (**(local_2b8.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_2b8.super_Pipeline._typeless.ops.disposer,pPVar2,8,sVar3,sVar3,0);
  }
  pPVar13 = local_2b8.super_Pipeline._typeless.hook.ptr;
  if ((WirePointer *)local_2b8.super_Pipeline._typeless.hook.ptr != (WirePointer *)0x0) {
    local_2b8.super_Pipeline._typeless.hook.ptr = (PipelineHook *)0x0;
    (**(local_2b8.super_Pipeline._typeless.hook.disposer)->_vptr_Disposer)
              (local_2b8.super_Pipeline._typeless.hook.disposer,
               *(_func_int **)((long)*(WirePointer *)pPVar13 + -0x10) +
               (long)&pPVar13->_vptr_PipelineHook);
  }
  pPVar1 = local_2b8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.ptr;
  if ((CapTableReader *)
      local_2b8.
      super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
      super_PromiseBase.node.ptr != (CapTableReader *)0x0) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)((Arena *)
              (local_2b8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.disposer)->_vptr_Disposer)->_vptr_Arena)
              (local_2b8.
               super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
               .super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2])
              );
  }
  if ((local_274 != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.disposer =
         (Disposer *)
         ((ulong)local_2b8.
                 super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                 .super_PromiseBase.node.disposer & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x87,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_2b8,&local_274);
  }
  if ((local_2bc != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_2b8.
    super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
    super_PromiseBase.node.disposer =
         (Disposer *)
         ((ulong)local_2b8.
                 super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
                 .super_PromiseBase.node.disposer & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(0) == (chainedCallCount)\", 0, chainedCallCount",
               (char (*) [43])"failed: expected (0) == (chainedCallCount)",(int *)&local_2b8,
               &local_2bc);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_2b8,&local_1e0);
  if (local_2b8.super_Pipeline._typeless.ops.ptr._4_2_ == 0) {
    uVar11 = 0x7fffffff;
    local_270._typeless.hook.ptr = (PipelineHook *)0x0;
    local_270._typeless.ops.ptr = (PipelineOp *)0x0;
    local_270._typeless.hook.disposer = (Disposer *)0x0;
  }
  else {
    local_270._typeless.hook.ptr =
         (PipelineHook *)
         local_2b8.
         super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
         super_PromiseBase.node.ptr;
    local_270._typeless.ops.ptr = (PipelineOp *)local_2b8.super_Pipeline._typeless.hook.ptr;
    local_270._typeless.hook.disposer =
         local_2b8.
         super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>.
         super_PromiseBase.node.disposer;
    uVar11 = (undefined4)local_2b8.super_Pipeline._typeless.ops.size_;
  }
  local_270._typeless.ops.size_ = CONCAT44(local_270._typeless.ops.size_._4_4_,uVar11);
  RVar18 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_270,(void *)0x0,0);
  if (((RVar18.super_StringPtr.content.size_ != 4) ||
      (iVar12 = bcmp(RVar18.super_StringPtr.content.ptr,"bar",3), iVar12 != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2b8.super_Pipeline._typeless.ops.ptr._4_2_ =
         (short)((ulong)local_2b8.super_Pipeline._typeless.ops.ptr >> 0x20);
    if (local_2b8.super_Pipeline._typeless.ops.ptr._4_2_ == 0) {
      local_2b8.super_Pipeline._typeless.ops.size_._0_4_ = 0x7fffffff;
      local_270._typeless.hook.ptr = (PipelineHook *)0x0;
      local_270._typeless.ops.ptr = (PipelineOp *)0x0;
      local_270._typeless.hook.disposer = (Disposer *)0x0;
    }
    else {
      local_270._typeless.hook.ptr =
           (PipelineHook *)
           local_2b8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.ptr;
      local_270._typeless.ops.ptr = (PipelineOp *)local_2b8.super_Pipeline._typeless.hook.ptr;
      local_270._typeless.hook.disposer =
           local_2b8.
           super_Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>
           .super_PromiseBase.node.disposer;
    }
    local_270._typeless.ops.size_._4_4_ = (undefined4)(local_270._typeless.ops.size_ >> 0x20);
    local_270._typeless.ops.size_ =
         CONCAT44(local_270._typeless.ops.size_._4_4_,
                  (undefined4)local_2b8.super_Pipeline._typeless.ops.size_);
    local_230 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)&local_270,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[46],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x8b,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (response.getX())\", \"bar\", response.getX()"
               ,(char (*) [46])"failed: expected (\"bar\") == (response.getX())",
               (char (*) [4])0x502717,(Reader *)&local_230);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestAllTypes>_> *)&local_270,
             &local_1a8);
  reader._reader.capTable = (CapTableReader *)local_270._typeless.hook.ptr;
  reader._reader.segment = (SegmentReader *)local_270._typeless.hook.disposer;
  reader._reader.data = local_270._typeless.ops.ptr;
  reader._reader.pointers = (WirePointer *)local_270._typeless.ops.size_;
  reader._reader._32_8_ = local_270._typeless.ops.disposer;
  reader._reader._40_8_ = uStack_248;
  checkTestMessage(reader);
  if ((local_274 != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_230.ptr._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x90,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)&local_230,&local_274);
  }
  if ((local_2bc != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_230.ptr._0_4_ = 1;
    kj::_::Debug::log<char_const(&)[43],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x91,ERROR,
               "\"failed: expected \" \"(1) == (chainedCallCount)\", 1, chainedCallCount",
               (char (*) [43])"failed: expected (1) == (chainedCallCount)",(int *)&local_230,
               &local_2bc);
  }
  plVar4 = local_238;
  if (local_238 != (long *)0x0) {
    local_238 = (long *)0x0;
    (**(code **)*local_240)(local_240,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  plVar4 = local_280;
  if (local_280 != (long *)0x0) {
    local_280 = (long *)0x0;
    (**(local_2b8.super_Pipeline._typeless.ops.disposer)->_vptr_ArrayDisposer)
              (local_2b8.super_Pipeline._typeless.ops.disposer,
               (long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  pDVar6 = local_1a8.hook.disposer;
  uVar5 = local_1a8.super_Builder._builder._32_8_;
  if (local_1a8.super_Builder._builder._32_8_ != 0) {
    local_1a8.super_Builder._builder.dataSize = 0;
    local_1a8.super_Builder._builder.pointerCount = 0;
    local_1a8.super_Builder._builder._38_2_ = 0;
    local_1a8.hook.disposer = (Disposer *)0x0;
    (**(local_1a8.hook.ptr)->_vptr_RequestHook)(local_1a8.hook.ptr,uVar5,8,pDVar6,pDVar6,0);
  }
  pWVar8 = local_1a8.super_Builder._builder.pointers;
  if (local_1a8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1a8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (***(_func_int ***)local_1a8.super_Builder._builder.data)
              (local_1a8.super_Builder._builder.data,
               (long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
  }
  pCVar7 = local_1a8.super_Builder._builder.capTable;
  if ((SegmentBuilder *)local_1a8.super_Builder._builder.capTable != (SegmentBuilder *)0x0) {
    local_1a8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)((local_1a8.super_Builder._builder.segment)->super_SegmentReader).arena)
              (local_1a8.super_Builder._builder.segment,
               (_func_int *)
               ((long)((SegmentReader *)&pCVar7->super_CapTableReader)->arena[-2]._vptr_Arena +
               (long)&pCVar7->super_CapTableReader));
  }
  pRVar10 = local_110.hook.ptr;
  if (local_110.hook.ptr != (RequestHook *)0x0) {
    local_110.hook.ptr = (RequestHook *)0x0;
    (**(local_110.hook.disposer)->_vptr_Disposer)
              (local_110.hook.disposer,
               pRVar10->_vptr_RequestHook[-2] + (long)&pRVar10->_vptr_RequestHook);
  }
  pDVar6 = local_1e0.hook.disposer;
  uVar5 = local_1e0.super_Builder._builder._32_8_;
  if (local_1e0.super_Builder._builder._32_8_ != 0) {
    local_1e0.super_Builder._builder.dataSize = 0;
    local_1e0.super_Builder._builder.pointerCount = 0;
    local_1e0.super_Builder._builder._38_2_ = 0;
    local_1e0.hook.disposer = (Disposer *)0x0;
    (**(local_1e0.hook.ptr)->_vptr_RequestHook)(local_1e0.hook.ptr,uVar5,8,pDVar6,pDVar6,0);
  }
  pWVar8 = local_1e0.super_Builder._builder.pointers;
  if (local_1e0.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_1e0.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_1e0.super_Builder._builder.data)
              (local_1e0.super_Builder._builder.data,
               (long)&(pWVar8->offsetAndKind).value + *(long *)((long)*pWVar8 + -0x10));
  }
  pCVar7 = local_1e0.super_Builder._builder.capTable;
  if (local_1e0.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1e0.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1e0.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1e0.super_Builder._builder.segment,
      (pCVar7->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar7->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar10 = local_d8.hook.ptr;
  if (local_d8.hook.ptr != (RequestHook *)0x0) {
    local_d8.hook.ptr = (RequestHook *)0x0;
    (**(local_d8.hook.disposer)->_vptr_Disposer)
              (local_d8.hook.disposer,
               pRVar10->_vptr_RequestHook[-2] + (long)&pRVar10->_vptr_RequestHook);
  }
  pDVar6 = pDStack_1f0;
  pPVar2 = local_1f8;
  if (local_1f8 != (PipelineOp *)0x0) {
    local_1f8 = (PipelineOp *)0x0;
    pDStack_1f0 = (Disposer *)0x0;
    (**local_1e8->_vptr_ArrayDisposer)(local_1e8,pPVar2,8,pDVar6,pDVar6,0);
  }
  uVar5 = local_218._24_8_;
  if ((WirePointer *)local_218._24_8_ != (WirePointer *)0x0) {
    local_218._24_8_ = (WirePointer *)0x0;
    (***(_func_int ***)local_218._16_8_)
              (local_218._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar5)->value +
               *(long *)((long)*(WirePointer *)uVar5 + -0x10));
  }
  uVar5 = local_218._8_8_;
  if ((PromiseNode *)local_218._8_8_ != (PromiseNode *)0x0) {
    local_218._8_8_ = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)local_218._0_8_)->arena->_vptr_Arena)
              (local_218._0_8_,
               ((CapTableReader *)uVar5)->_vptr_CapTableReader[-2] + (long)(CapTableReader *)uVar5);
  }
  pRVar10 = local_148.hook.ptr;
  if (local_148.hook.ptr != (RequestHook *)0x0) {
    local_148.hook.ptr = (RequestHook *)0x0;
    (**(local_148.hook.disposer)->_vptr_Disposer)
              (local_148.hook.disposer,
               pRVar10->_vptr_RequestHook[-2] + (long)&pRVar10->_vptr_RequestHook);
  }
  pCVar9 = local_168.hook.ptr;
  if (local_168.hook.ptr != (ClientHook *)0x0) {
    local_168.hook.ptr = (ClientHook *)0x0;
    (**(local_168.hook.disposer)->_vptr_Disposer)
              (local_168.hook.disposer,
               pCVar9->_vptr_ClientHook[-2] + (long)&pCVar9->_vptr_ClientHook);
  }
  kj::EventLoop::leaveScope(local_158);
  kj::EventLoop::~EventLoop(&local_a0);
  return;
}

Assistant:

TEST(Capability, Pipelining) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  int chainedCallCount = 0;
  test::TestPipeline::Client client(kj::heap<TestPipelineImpl>(callCount));

  auto request = client.getCapRequest();
  request.setN(234);
  request.setInCap(test::TestInterface::Client(kj::heap<TestInterfaceImpl>(chainedCallCount)));

  auto promise = request.send();

  auto pipelineRequest = promise.getOutBox().getCap().fooRequest();
  pipelineRequest.setI(321);
  auto pipelinePromise = pipelineRequest.send();

  auto pipelineRequest2 = promise.getOutBox().getCap().castAs<test::TestExtends>().graultRequest();
  auto pipelinePromise2 = pipelineRequest2.send();

  promise = nullptr;  // Just to be annoying, drop the original promise.

  EXPECT_EQ(0, callCount);
  EXPECT_EQ(0, chainedCallCount);

  auto response = pipelinePromise.wait(waitScope);
  EXPECT_EQ("bar", response.getX());

  auto response2 = pipelinePromise2.wait(waitScope);
  checkTestMessage(response2);

  EXPECT_EQ(3, callCount);
  EXPECT_EQ(1, chainedCallCount);
}